

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall SWDAnalyzerSettings::SetSettingsFromInterfaces(SWDAnalyzerSettings *this)

{
  byte bVar1;
  Channel local_88 [16];
  Channel local_78 [16];
  Channel local_68 [16];
  Channel local_58 [32];
  Channel local_38 [16];
  Channel local_28 [16];
  SWDAnalyzerSettings *local_18;
  SWDAnalyzerSettings *this_local;
  
  local_18 = this;
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator==(local_28,local_38);
  Channel::~Channel(local_38);
  Channel::~Channel(local_28);
  if ((bVar1 & 1) == 0) {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_68,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar1 = Channel::operator==(local_58,local_68);
    Channel::~Channel(local_68);
    Channel::~Channel(local_58);
    if ((bVar1 & 1) == 0) {
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mSWDIO,local_78);
      Channel::~Channel(local_78);
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=(&this->mSWCLK,local_88);
      Channel::~Channel(local_88);
      bVar1 = Channel::operator==(&this->mSWDIO,&this->mSWCLK);
      if ((bVar1 & 1) == 0) {
        AnalyzerSettings::ClearChannels();
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWDIO,true);
        AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWCLK,true);
        this_local._7_1_ = true;
      }
      else {
        AnalyzerSettings::SetErrorText((char *)this);
        this_local._7_1_ = false;
      }
    }
    else {
      AnalyzerSettings::SetErrorText((char *)this);
      this_local._7_1_ = false;
    }
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SWDAnalyzerSettings::SetSettingsFromInterfaces()
{
    if( mSWDIOInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the channel 1." );
        return false;
    }

    if( mSWCLKInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the channel 2." );
        return false;
    }

    mSWDIO = mSWDIOInterface.GetChannel();
    mSWCLK = mSWCLKInterface.GetChannel();

    if( mSWDIO == mSWCLK )
    {
        SetErrorText( "Please select different inputs for the channels." );
        return false;
    }

    ClearChannels();

    AddChannel( mSWDIO, "SWDIO", true );
    AddChannel( mSWCLK, "SWCLK", true );

    return true;
}